

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
S2BooleanOperation::Impl::IsFullPolygonUnion(Impl *this,S2ShapeIndex *a,S2ShapeIndex *b)

{
  byte bVar1;
  byte bVar2;
  double *pdVar3;
  double local_58;
  double local_50 [2];
  double max_area;
  double min_area;
  double b_area;
  double a_area;
  S2ShapeIndex *b_local;
  S2ShapeIndex *a_local;
  Impl *this_local;
  
  a_area = (double)b;
  b_local = a;
  a_local = (S2ShapeIndex *)this;
  bVar1 = GetFaceMask(a);
  bVar2 = GetFaceMask((S2ShapeIndex *)a_area);
  if ((bVar1 | bVar2) == 0x3f) {
    b_area = S2::GetArea(b_local);
    min_area = S2::GetArea((S2ShapeIndex *)a_area);
    pdVar3 = std::max<double>(&b_area,&min_area);
    max_area = *pdVar3;
    local_50[0] = 12.566370614359172;
    local_58 = b_area + min_area;
    pdVar3 = std::min<double>(local_50,&local_58);
    this_local._7_1_ = 12.566370614359172 - *pdVar3 < max_area;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool S2BooleanOperation::Impl::IsFullPolygonUnion(
    const S2ShapeIndex& a, const S2ShapeIndex& b) const {
  // See comments in IsFullPolygonResult().  The most common case is that
  // neither input polygon is empty but the result is empty due to snapping.

  // The result can be full only if the union of the two input geometries
  // intersects all six faces of the S2 cube.  This test is fast.
  if ((GetFaceMask(a) | GetFaceMask(b)) != kAllFacesMask) return false;

  // The union area satisfies:
  //
  //   max(A, B) <= Union(A, B) <= min(4*Pi, A + B)
  //
  // where A, B can refer to a polygon or its area.  We then choose the result
  // that assumes the smallest amount of error.
  double a_area = S2::GetArea(a), b_area = S2::GetArea(b);
  double min_area = max(a_area, b_area);
  double max_area = min(4 * M_PI, a_area + b_area);
  return min_area > 4 * M_PI - max_area;
}